

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

bool ON_ChangeRationalNurbsCurveEndWeights
               (int dim,int order,int cv_count,int cvstride,double *cv,double *knot,double w0,
               double w1)

{
  int cv_dim;
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  
  bVar4 = ON_IsValid(w0);
  if (bVar4) {
    bVar4 = ON_IsValid(w1);
    if ((w1 == 0.0) && (!NAN(w1))) {
      return false;
    }
    if ((w0 == 0.0) && (!NAN(w0))) {
      return false;
    }
    if (!bVar4) {
      return false;
    }
    if (((0.0 <= w0) || (w1 <= 0.0)) && ((w0 <= 0.0 || (0.0 <= w1)))) {
      cv_dim = dim + 1;
      bVar4 = ON_ClampKnotVector(cv_dim,order,cv_count,cvstride,cv,knot,2);
      if (bVar4) {
        dVar7 = cv[dim];
        iVar5 = (cv_count + -1) * cvstride + dim;
        dVar1 = cv[iVar5];
        bVar4 = ON_IsValid(dVar7);
        if (bVar4) {
          bVar4 = ON_IsValid(dVar1);
          if ((dVar7 == 0.0) && (!NAN(dVar7))) {
            return false;
          }
          if (!bVar4) {
            return false;
          }
          if ((dVar1 == 0.0) && (!NAN(dVar1))) {
            return false;
          }
          if (((0.0 <= dVar7) || (dVar1 <= 0.0)) && ((dVar7 <= 0.0 || (0.0 <= dVar1)))) {
            auVar8._8_8_ = w1;
            auVar8._0_8_ = w0;
            auVar2._8_8_ = dVar1;
            auVar2._0_8_ = dVar7;
            auVar9 = divpd(auVar8,auVar2);
            dVar10 = auVar9._8_8_;
            dVar7 = auVar9._0_8_;
            if (ABS(dVar7 - dVar10) <= ABS(dVar10) * 1.490116119385e-08) {
              auVar9._0_8_ = ~-(ulong)(dVar7 != dVar10) & (ulong)dVar10 |
                             (ulong)((dVar7 + dVar10) * 0.5) & -(ulong)(dVar7 != dVar10);
              auVar9._8_8_ = auVar9._0_8_;
            }
            dVar7 = auVar9._8_8_;
            if ((dVar7 != 1.0) || (NAN(dVar7))) {
              if ((dVar1 != w1) || (NAN(dVar1) || NAN(w1))) {
                if (cv_count != 0) {
                  iVar3 = cv_dim;
                  iVar6 = cv_count;
                  do {
                    for (; iVar3 != 0; iVar3 = iVar3 + -1) {
                      *cv = *cv * dVar7;
                      cv = cv + 1;
                    }
                    cv = cv + (cvstride - cv_dim);
                    iVar6 = iVar6 + -1;
                    iVar3 = cv_dim;
                  } while (iVar6 != 0);
                }
                cv = cv + -(long)(cvstride * cv_count);
              }
            }
            if ((auVar9._0_8_ != dVar7) || (NAN(auVar9._0_8_) || NAN(dVar7))) {
              dVar7 = cv[dim];
              dVar1 = cv[iVar5];
              bVar4 = ON_IsValid(dVar7);
              if (bVar4) {
                bVar4 = ON_IsValid(dVar1);
                if (((dVar7 != 0.0) || (NAN(dVar7))) && (bVar4)) {
                  dVar7 = pow(w0 / dVar7,1.0 / (double)(order + -1));
                  bVar4 = ON_IsValid(dVar7);
                  if (!bVar4) {
                    return false;
                  }
                  bVar4 = ON_ReparameterizeRationalNurbsCurve
                                    (dVar7,dim,order,cv_count,cvstride,cv,knot);
                  if (!bVar4) {
                    return false;
                  }
                }
              }
            }
            cv[dim] = w0;
            cv[iVar5] = w1;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_ChangeRationalNurbsCurveEndWeights(
          int dim, 
          int order, 
          int cv_count,
          int cvstride, 
          double* cv, 
          double* knot,
          double w0, 
          double w1
          )
{
  double r, s, v0, v1;
  int i, j;

  if ( !ON_IsValid(w0) || !ON_IsValid(w1) || 0.0 == w0 || 0.0 == w1 )
    return false;
  if ( (w0 < 0.0 && w1 > 0.0) || (w0 > 0.0 && w1 < 0.0) )
    return false;

  if ( !ON_ClampKnotVector( dim+1, order, cv_count, cvstride, cv, knot, 2 ) )
    return false;

  v0 = cv[dim];
  v1 = cv[cvstride*(cv_count-1)+dim];
  if (!ON_IsValid(v0) || !ON_IsValid(v1) || v0 == 0.0 || v1 == 0.0)
    return false;
  if (v0 < 0.0 && v1 > 0.0)
    return false;
  if ( v0 > 0.0 && v1 < 0.0)
    return false;

  r = w0/v0;
  s = w1/v1;
  if ( fabs(r-s) <= fabs(s)*ON_SQRT_EPSILON )
  {
    // simply scale
    if ( r != s )
      s = 0.5*(r+s);
    r = s;
  }

  if ( 1.0 != s && v1 != w1 )
  {
    // scale to get last weight set to w1
    dim++;
    cvstride -= dim;
    i = cv_count;
    while(i--)
    {
      j = dim;
      while(j--)
        *cv++ *= s;
      cv += cvstride;
    }
    cvstride += dim;
    dim--;
    cv -= cvstride*cv_count;
  }

  if ( r != s )
  {
    v0 = cv[dim];
    v1 = cv[cvstride*(cv_count-1)+dim];
    if ( ON_IsValid(v0) && ON_IsValid(v1) && 0.0 != v0 )
    {
      // need to scale and reparameterize
      r = pow(w0/v0,1.0/((double)(order-1)));
      if ( !ON_IsValid(r) )
        return false;
      if ( !ON_ReparameterizeRationalNurbsCurve(r,dim,order,cv_count,cvstride,cv,knot) )
        return false;
    }
  }

  // make sure weights agree to the last bit! 
  cv[dim] = w0;
  cv[cvstride*(cv_count-1)+dim] = w1;

  return true;
}